

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O2

base_learner * sender_setup(options_i *options,vw *all)

{
  undefined8 uVar1;
  _Head_base<0UL,_sender_*,_false> s_00;
  int iVar2;
  example **ppeVar3;
  learner<sender,_example> *plVar4;
  allocator local_192;
  allocator local_191;
  string local_190 [32];
  string host;
  string local_150;
  string local_130;
  string local_110;
  free_ptr<sender> s;
  string local_c0 [64];
  bool local_80;
  option_group_definition sender_options;
  
  host._M_dataplus._M_p = (pointer)&host.field_2;
  host._M_string_length = 0;
  host.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_110,"Network sending",(allocator *)&s);
  VW::config::option_group_definition::option_group_definition(&sender_options,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,"sendto",&local_191);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&s,&local_130,&host);
  local_80 = true;
  std::__cxx11::string::string(local_190,"send examples to <host>",&local_192);
  std::__cxx11::string::_M_assign(local_c0);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&sender_options,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&s);
  std::__cxx11::string::~string(local_190);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&s);
  std::__cxx11::string::~string((string *)&local_130);
  (**options->_vptr_options_i)(options,&sender_options);
  std::__cxx11::string::string((string *)&s,"sendto",(allocator *)local_190);
  iVar2 = (*options->_vptr_options_i[1])(options,&s);
  std::__cxx11::string::~string((string *)&s);
  if ((char)iVar2 == '\0') {
    plVar4 = (learner<sender,_example> *)0x0;
  }
  else {
    scoped_calloc_or_throw<sender>();
    s_00 = s._M_t.super___uniq_ptr_impl<sender,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_sender_*,_void_(*)(void_*)>.super__Head_base<0UL,_sender_*,_false>
    ;
    (s._M_t.super___uniq_ptr_impl<sender,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_sender_*,_void_(*)(void_*)>.super__Head_base<0UL,_sender_*,_false>.
    _M_head_impl)->sd = -1;
    std::__cxx11::string::string((string *)&local_150,(string *)&host);
    open_sockets(s_00._M_head_impl,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    (s._M_t.super___uniq_ptr_impl<sender,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_sender_*,_void_(*)(void_*)>.super__Head_base<0UL,_sender_*,_false>.
    _M_head_impl)->all = all;
    ppeVar3 = calloc_or_throw<example*>(all->p->ring_size);
    (s._M_t.super___uniq_ptr_impl<sender,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_sender_*,_void_(*)(void_*)>.super__Head_base<0UL,_sender_*,_false>.
    _M_head_impl)->delay_ring = ppeVar3;
    plVar4 = LEARNER::init_learner<sender,example,LEARNER::learner<char,example>>(&s,learn,learn,1);
    uVar1 = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0xb8) = uVar1;
    *(undefined8 *)(plVar4 + 0xc0) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 200) = finish;
    *(undefined8 *)(plVar4 + 0x58) = uVar1;
    *(code **)(plVar4 + 0x68) = finish_example;
    *(undefined8 *)(plVar4 + 0xa0) = uVar1;
    *(undefined8 *)(plVar4 + 0xa8) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 0xb0) = end_examples;
    std::unique_ptr<sender,_void_(*)(void_*)>::~unique_ptr(&s);
  }
  VW::config::option_group_definition::~option_group_definition(&sender_options);
  std::__cxx11::string::~string((string *)&host);
  return (base_learner *)plVar4;
}

Assistant:

LEARNER::base_learner* sender_setup(options_i& options, vw& all)
{
  string host;

  option_group_definition sender_options("Network sending");
  sender_options.add(make_option("sendto", host).keep().help("send examples to <host>"));
  options.add_and_parse(sender_options);

  if (!options.was_supplied("sendto"))
  {
    return nullptr;
  }

  auto s = scoped_calloc_or_throw<sender>();
  s->sd = -1;
  open_sockets(*s.get(), host);

  s->all = &all;
  s->delay_ring = calloc_or_throw<example*>(all.p->ring_size);

  LEARNER::learner<sender, example>& l = init_learner(s, learn, learn, 1);
  l.set_finish(finish);
  l.set_finish_example(finish_example);
  l.set_end_examples(end_examples);
  return make_base(l);
}